

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestOutOfCoreCHECKMacrosCanFailTests::RunImpl
          (TestOutOfCoreCHECKMacrosCanFailTests *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_70;
  int local_4c [5];
  undefined1 local_38 [8];
  ScopedCurrentTest scopedResult;
  TestResults results;
  TestOutOfCoreCHECKMacrosCanFailTests *this_local;
  
  UnitTest::TestResults::TestResults
            ((TestResults *)&scopedResult.m_oldTestDetails,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_38,(TestResults *)&scopedResult.m_oldTestDetails,
             (TestDetails *)0x0);
  Fail();
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_38);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_4c[1] = 1;
  local_4c[0] = UnitTest::TestResults::GetFailureCount
                          ((TestResults *)&scopedResult.m_oldTestDetails);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_70,*ppTVar2,0x7e);
  UnitTest::CheckEqual<int,int>(results_00,local_4c + 1,local_4c,&local_70);
  return;
}

Assistant:

TEST(OutOfCoreCHECKMacrosCanFailTests)
{
	TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		Fail();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}